

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O2

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::
_throwValueErrorNotFound
          (HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
           *this,pair<unsigned_long,_long> *value)

{
  ValueError *this_00;
  allocator local_31;
  string err_msg;
  
  std::__cxx11::string::string((string *)&err_msg,"Value not found.",&local_31);
  this_00 = (ValueError *)__cxa_allocate_exception(0x28);
  ValueError::ValueError(this_00,&err_msg);
  __cxa_throw(this_00,&ValueError::typeinfo,Exception::~Exception);
}

Assistant:

void HeadNode<T, _Compare>::_throwValueErrorNotFound(const T &value) const {
#ifdef INCLUDE_METHODS_THAT_USE_STREAMS
    std::ostringstream oss;
    oss << "Value " << value << " not found.";
    std::string err_msg = oss.str();
#else
    std::string err_msg = "Value not found.";
#endif
    throw ValueError(err_msg);
}